

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

SyntaxNode * __thiscall slang::parsing::Parser::parseForInitializer(Parser *this)

{
  bool bVar1;
  ForVariableDeclarationSyntax *pFVar2;
  SyntaxNode *pSVar3;
  ParserBase *in_RDI;
  ForVariableDeclarationSyntax *result;
  DeclaratorSyntax *decl;
  DataTypeSyntax *type;
  Token varKeyword;
  Parser *in_stack_00000300;
  bitmask<slang::parsing::detail::TypeOptions> in_stack_0000030c;
  DataTypeSyntax *in_stack_ffffffffffffff88;
  ParserBase *type_00;
  Token in_stack_ffffffffffffff98;
  bitmask<slang::parsing::detail::TypeOptions> local_2c;
  DataTypeSyntax *local_28;
  Token local_20;
  ForVariableDeclarationSyntax *local_8;
  
  bVar1 = isVariableDeclaration
                    ((Parser *)
                     CONCAT17(varKeyword.rawLen._3_1_,
                              CONCAT16(varKeyword.rawLen._2_1_,varKeyword._0_6_)));
  if (bVar1) {
    local_20 = ParserBase::consumeIf(in_RDI,(TokenKind)((ulong)in_stack_ffffffffffffff88 >> 0x30));
    memset(&local_2c,0,4);
    bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_2c);
    local_28 = parseDataType(in_stack_00000300,in_stack_0000030c);
    parseDeclarator((Parser *)varKeyword.info,varKeyword.rawLen._3_1_,varKeyword.rawLen._2_1_);
    pFVar2 = slang::syntax::SyntaxFactory::forVariableDeclaration
                       ((SyntaxFactory *)in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff88,
                        (DeclaratorSyntax *)0xc39837);
    pSVar3 = std::exchange<slang::syntax::SyntaxNode_const*,decltype(nullptr)>
                       ((SyntaxNode **)in_RDI,(void **)in_stack_ffffffffffffff88);
    (pFVar2->super_SyntaxNode).previewNode = pSVar3;
    local_8 = pFVar2;
  }
  else {
    type_00 = in_RDI + 1;
    Token::Token((Token *)in_RDI);
    parseDeclarator((Parser *)varKeyword.info,varKeyword.rawLen._3_1_,varKeyword.rawLen._2_1_);
    local_8 = slang::syntax::SyntaxFactory::forVariableDeclaration
                        ((SyntaxFactory *)in_RDI,in_stack_ffffffffffffff98,(DataTypeSyntax *)type_00
                         ,(DeclaratorSyntax *)0xc398b4);
  }
  return &local_8->super_SyntaxNode;
}

Assistant:

SyntaxNode& Parser::parseForInitializer() {
    if (isVariableDeclaration()) {
        auto varKeyword = consumeIf(TokenKind::VarKeyword);
        auto& type = parseDataType();
        auto& decl = parseDeclarator(/* allowMinTypMax */ false,
                                     /* requireInitializers */ true);
        auto& result = factory.forVariableDeclaration(varKeyword, &type, decl);
        result.previewNode = std::exchange(previewNode, nullptr);
        return result;
    }

    return factory.forVariableDeclaration(Token(), nullptr, parseDeclarator());
}